

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.h
# Opt level: O1

void * __thiscall tinyxml2::MemPoolT<96>::Alloc(MemPoolT<96> *this)

{
  int iVar1;
  int iVar2;
  Chunk *__s;
  Chunk *pCVar3;
  long lVar4;
  
  if (this->_root == (Chunk *)0x0) {
    __s = (Chunk *)operator_new(0xfc0);
    memset(__s,0,0xfc0);
    DynArray<tinyxml2::MemPoolT<96>::Block_*,_10>::EnsureCapacity
              (&this->_blockPtrs,(this->_blockPtrs)._size + 1);
    iVar1 = (this->_blockPtrs)._size;
    (this->_blockPtrs)._size = iVar1 + 1;
    (this->_blockPtrs)._mem[iVar1] = (Block *)__s;
    lVar4 = 0x29;
    pCVar3 = __s;
    do {
      pCVar3->next = pCVar3 + 1;
      lVar4 = lVar4 + -1;
      pCVar3 = pCVar3 + 1;
    } while (lVar4 != 0);
    __s[0x29].next = (Chunk *)0x0;
    this->_root = __s;
  }
  pCVar3 = this->_root;
  this->_root = pCVar3->next;
  iVar2 = this->_currentAllocs;
  iVar1 = iVar2 + 1;
  this->_currentAllocs = iVar1;
  if (this->_maxAllocs <= iVar2) {
    this->_maxAllocs = iVar1;
  }
  this->_nAllocs = this->_nAllocs + 1;
  this->_nUntracked = this->_nUntracked + 1;
  return pCVar3;
}

Assistant:

virtual void* Alloc() {
        if ( !_root ) {
            // Need a new block.
            Block* block = new Block();
            _blockPtrs.Push( block );

            for( int i=0; i<COUNT-1; ++i ) {
                block->chunk[i].next = &block->chunk[i+1];
            }
            block->chunk[COUNT-1].next = 0;
            _root = block->chunk;
        }
        void* result = _root;
        _root = _root->next;

        ++_currentAllocs;
        if ( _currentAllocs > _maxAllocs ) {
            _maxAllocs = _currentAllocs;
        }
        _nAllocs++;
        _nUntracked++;
        return result;
    }